

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O2

void * Abc_NtkMiterSatCreate(Abc_Ntk_t *pNtk,int fAllPrimes)

{
  int iVar1;
  sat_solver *s;
  Abc_Obj_t *pAVar2;
  Mem_Flex_t *pMmMan;
  Vec_Str_t *vCube;
  char *pcVar3;
  Vec_Int_t *vVars;
  int iVar4;
  char *local_40;
  char *pSop0;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    nMuxes = 0;
    s = sat_solver_new();
    iVar1 = Abc_NtkMiterSatCreateInt(s,pNtk);
    sat_solver_store_mark_roots(s);
    for (iVar4 = 0; iVar4 < pNtk->vObjs->nSize; iVar4 = iVar4 + 1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar4);
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        pAVar2->field_0x14 = pAVar2->field_0x14 & 0xef;
      }
    }
    if (iVar1 == 0) {
      sat_solver_delete(s);
      s = (sat_solver *)0x0;
    }
  }
  else {
    if ((pNtk->ntkType != ABC_NTK_LOGIC) || (pNtk->ntkFunc != ABC_FUNC_BDD)) {
      __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                    ,0x27e,"void *Abc_NtkMiterSatCreate(Abc_Ntk_t *, int)");
    }
    for (iVar1 = 0; iVar1 < pNtk->vPis->nSize; iVar1 = iVar1 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,iVar1);
      pAVar2->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)pAVar2->Id;
    }
    s = sat_solver_new();
    sat_solver_store_alloc(s);
    pMmMan = Mem_FlexStart();
    vCube = (Vec_Str_t *)malloc(0x10);
    vCube->nCap = 100;
    vCube->nSize = 0;
    pcVar3 = (char *)malloc(100);
    vCube->pArray = pcVar3;
    vVars = Vec_IntAlloc(100);
    for (iVar1 = 0; iVar1 < pNtk->vObjs->nSize; iVar1 = iVar1 + 1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar1);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        Abc_NodeBddToCnf(pAVar2,pMmMan,vCube,fAllPrimes,&pSop0,&local_40);
        iVar4 = Abc_NodeAddClauses(s,pSop0,local_40,pAVar2,vVars);
        if (iVar4 == 0) goto LAB_0026f79c;
      }
    }
    iVar1 = 0;
    do {
      if (pNtk->vPos->nSize <= iVar1) {
        sat_solver_store_mark_roots(s);
        goto LAB_0026f7b0;
      }
      pAVar2 = Abc_NtkPo(pNtk,iVar1);
      iVar4 = Abc_NodeAddClausesTop(s,pAVar2,vVars);
      iVar1 = iVar1 + 1;
    } while (iVar4 != 0);
LAB_0026f79c:
    sat_solver_delete(s);
    s = (sat_solver *)0x0;
LAB_0026f7b0:
    free(vCube->pArray);
    free(vCube);
    Vec_IntFree(vVars);
    Mem_FlexStop(pMmMan,0);
  }
  return s;
}

Assistant:

void * Abc_NtkMiterSatCreate( Abc_Ntk_t * pNtk, int fAllPrimes )
{
    sat_solver * pSat;
    Abc_Obj_t * pNode;
    int RetValue, i; //, clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk) );
    if ( Abc_NtkIsBddLogic(pNtk) )
        return Abc_NtkMiterSatCreateLogic(pNtk, fAllPrimes);

    nMuxes = 0;
    pSat = sat_solver_new();
//sat_solver_store_alloc( pSat );
    RetValue = Abc_NtkMiterSatCreateInt( pSat, pNtk );
sat_solver_store_mark_roots( pSat );

    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->fMarkA = 0;
//    ASat_SolverWriteDimacs( pSat, "temp_sat.cnf", NULL, NULL, 1 );
    if ( RetValue == 0 )
    {
        sat_solver_delete(pSat);
        return NULL;
    }
//    printf( "Ands = %6d.  Muxes = %6d (%5.2f %%).  ", Abc_NtkNodeNum(pNtk), nMuxes, 300.0*nMuxes/Abc_NtkNodeNum(pNtk) );
//    ABC_PRT( "Creating sat_solver", Abc_Clock() - clk );
    return pSat;
}